

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O3

void ST::format_type(format_spec *format,format_writer *output,wchar_t *wtext)

{
  undefined1 uVar1;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  char_buffer utf8;
  char *local_70;
  char local_60 [8];
  char acStack_58 [8];
  string local_50;
  
  if (wtext == (wchar_t *)0x0) {
    return;
  }
  string::from_wchar(&local_50,wtext,0xffffffffffffffff,check_validity);
  if (local_50.m_buffer.m_size < 0x10) {
    local_70 = local_60;
    local_60[0] = local_50.m_buffer.m_data[0];
    local_60[1] = local_50.m_buffer.m_data[1];
    local_60[2] = local_50.m_buffer.m_data[2];
    local_60[3] = local_50.m_buffer.m_data[3];
    local_60[4] = local_50.m_buffer.m_data[4];
    local_60[5] = local_50.m_buffer.m_data[5];
    local_60[6] = local_50.m_buffer.m_data[6];
    local_60[7] = local_50.m_buffer.m_data[7];
    acStack_58[0] = local_50.m_buffer.m_data[8];
    acStack_58[1] = local_50.m_buffer.m_data[9];
    acStack_58[2] = local_50.m_buffer.m_data[10];
    acStack_58[3] = local_50.m_buffer.m_data[0xb];
    acStack_58[4] = local_50.m_buffer.m_data[0xc];
    acStack_58[5] = local_50.m_buffer.m_data[0xd];
    acStack_58[6] = local_50.m_buffer.m_data[0xe];
    acStack_58[7] = local_50.m_buffer.m_data[0xf];
  }
  else {
    local_70 = (char *)operator_new__(local_50.m_buffer.m_size + 1);
    memcpy(local_70,local_50.m_buffer.m_chars,local_50.m_buffer.m_size);
    local_70[local_50.m_buffer.m_size] = '\0';
    if (local_50.m_buffer.m_chars != (char *)0x0) {
      operator_delete__(local_50.m_buffer.m_chars);
    }
  }
  uVar1 = format->pad;
  cVar3 = ' ';
  if (uVar1 != '\0') {
    cVar3 = uVar1;
  }
  uVar2 = (ulong)format->precision;
  uVar4 = local_50.m_buffer.m_size;
  if (uVar2 < local_50.m_buffer.m_size) {
    uVar4 = uVar2;
  }
  if ((long)uVar2 < 0) {
    uVar4 = local_50.m_buffer.m_size;
  }
  if ((int)uVar4 < format->minimum_length) {
    if (format->alignment != align_right) {
      (*output->_vptr_format_writer[2])(output,local_70,uVar4);
      (*output->_vptr_format_writer[3])
                (output,(ulong)(uint)(int)cVar3,(long)format->minimum_length - uVar4);
      goto LAB_001e857a;
    }
    (*output->_vptr_format_writer[3])
              (output,(ulong)(uint)(int)cVar3,(long)format->minimum_length - uVar4);
  }
  (*output->_vptr_format_writer[2])(output,local_70,uVar4);
LAB_001e857a:
  if ((0xf < local_50.m_buffer.m_size) && (local_70 != (char *)0x0)) {
    operator_delete__(local_70);
  }
  return;
}

Assistant:

inline void format_type(const ST::format_spec &format, ST::format_writer &output,
                            const wchar_t *wtext)
    {
        if (wtext) {
            ST::char_buffer utf8 = ST::string::from_wchar(wtext).to_utf8();
            ST::format_string(format, output, utf8.data(), utf8.size());
        }
    }